

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  any *paVar3;
  ctrl_t *pcVar4;
  proxy *ppVar5;
  slot_type *psVar6;
  undefined1 auVar7 [16];
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  undefined8 uVar23;
  int iVar24;
  ctrl_t *pcVar25;
  undefined4 extraout_var;
  size_t i;
  ulong uVar27;
  ulong uVar28;
  byte bVar29;
  size_t i_00;
  FindInfo FVar30;
  any aStack_38;
  ulong uVar26;
  
  aStack_38.mDat = (proxy *)this->capacity_;
  if (aStack_38.mDat == (proxy *)0x0) {
    resize(this,1);
    return;
  }
  if (((ulong)&(aStack_38.mDat)->field_0x1 & (ulong)aStack_38.mDat) != 0) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x288,"size_t phmap::priv::CapacityToGrowth(size_t)");
  }
  if ((long)aStack_38.mDat - ((ulong)aStack_38.mDat >> 3) >> 1 < this->size_) {
    resize(this,(long)aStack_38.mDat * 2 + 1);
    return;
  }
  uVar26 = this->capacity_;
  if ((uVar26 == 0) || ((uVar26 + 1 & uVar26) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f8,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<cs_impl::any>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<cs_impl::any>]"
                 );
  }
  if (uVar26 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f9,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<cs_impl::any>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<cs_impl::any>]"
                 );
  }
  pcVar4 = this->ctrl_;
  if (pcVar4[uVar26] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x270,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  pcVar25 = pcVar4 + uVar26;
  if (pcVar25 + 1 != pcVar4) {
    uVar28 = 0;
    do {
      pcVar1 = pcVar4 + uVar28;
      cVar8 = pcVar1[1];
      cVar9 = pcVar1[2];
      cVar10 = pcVar1[3];
      cVar11 = pcVar1[4];
      cVar12 = pcVar1[5];
      cVar13 = pcVar1[6];
      cVar14 = pcVar1[7];
      cVar15 = pcVar1[8];
      cVar16 = pcVar1[9];
      cVar17 = pcVar1[10];
      cVar18 = pcVar1[0xb];
      cVar19 = pcVar1[0xc];
      cVar20 = pcVar1[0xd];
      cVar21 = pcVar1[0xe];
      cVar22 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar4 + uVar28);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar8 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar22 < '\0') & 0x7eU ^ 0xfe;
      uVar28 = uVar28 + 0x10;
    } while (uVar26 + 1 != uVar28);
  }
  uVar23 = *(undefined8 *)(pcVar4 + 8);
  *(undefined8 *)(pcVar25 + 1) = *(undefined8 *)pcVar4;
  *(undefined8 *)(pcVar25 + 9) = uVar23;
  *pcVar25 = -1;
  if (this->capacity_ == 0) {
    i_00 = 0;
  }
  else {
    i_00 = 0;
    do {
      if (this->ctrl_[i_00] == -2) {
        ppVar5 = this->slots_[i_00].mDat;
        if (ppVar5 == (proxy *)0x0) {
          uVar26 = 0;
        }
        else {
          iVar24 = (*ppVar5->data->_vptr_baseHolder[7])();
          uVar26 = CONCAT44(extraout_var,iVar24);
        }
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar26;
        uVar28 = SUB168(auVar7 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar7 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar30 = find_first_non_full(this,uVar28);
        i = FVar30.offset;
        uVar26 = this->capacity_;
        if ((uVar26 + 1 & uVar26) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                        ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar27 = uVar28 >> 7 & uVar26;
        bVar29 = (byte)uVar28;
        if (((i_00 - uVar27 ^ i - uVar27) & uVar26) < 0x10) {
          bVar29 = bVar29 & 0x7f;
        }
        else {
          if (this->ctrl_[i] == -2) {
            set_ctrl(this,i,bVar29 & 0x7f);
            paVar3 = this->slots_ + i_00;
            aStack_38.mDat = paVar3->mDat;
            paVar3->mDat = (proxy *)0x0;
            cs_impl::any::recycle(paVar3);
            psVar6 = this->slots_;
            psVar6[i_00].mDat = (proxy *)0x0;
            psVar6[i_00].mDat = psVar6[i].mDat;
            psVar6[i].mDat = (proxy *)0x0;
            cs_impl::any::recycle(psVar6 + i);
            psVar6 = this->slots_;
            psVar6[i].mDat = (proxy *)0x0;
            psVar6[i].mDat = aStack_38.mDat;
            aStack_38.mDat = (proxy *)0x0;
            cs_impl::any::recycle(&aStack_38);
            i_00 = i_00 - 1;
            goto LAB_001a3b07;
          }
          if (this->ctrl_[i] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                          ,0x92b,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<cs_impl::any>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<cs_impl::any>]"
                         );
          }
          set_ctrl(this,i,bVar29 & 0x7f);
          psVar6 = this->slots_;
          paVar3 = psVar6 + i_00;
          psVar6[i].mDat = (proxy *)0x0;
          psVar6[i].mDat = paVar3->mDat;
          paVar3->mDat = (proxy *)0x0;
          cs_impl::any::recycle(paVar3);
          bVar29 = 0x80;
        }
        set_ctrl(this,i_00,bVar29);
      }
LAB_001a3b07:
      i_00 = i_00 + 1;
    } while (i_00 != this->capacity_);
  }
  reset_growth_left(this,i_00);
  return;
}

Assistant:

void rehash_and_grow_if_necessary()
			{
				if (capacity_ == 0) {
					resize(1);
				}
				else if (size() <= CapacityToGrowth(capacity()) / 2) {
					// Squash DELETED without growing if there is enough capacity.
					drop_deletes_without_resize();
				}
				else {
					// Otherwise grow the container.
					resize(capacity_ * 2 + 1);
				}
			}